

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O2

void Exa_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Exa_Man_t_conflict *p;
  Vec_Wec_t *p_00;
  Vec_Wrd_t *pVVar6;
  sat_solver *s;
  Vec_Int_t *pVVar7;
  word *pwVar8;
  word *pIn1;
  word *pIn2;
  abctime aVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  lit *end;
  abctime time;
  abctime time_00;
  int (*paaiVar14) [2] [32];
  char *pcVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  word *pwVar22;
  ulong uVar23;
  int (*paiVar24) [32];
  int (*paaiVar25) [2] [32];
  int local_1b0;
  int iMint;
  word *local_1a8;
  int (*local_1a0) [2] [32];
  int (*local_198) [2] [32];
  ulong local_190;
  ulong local_188;
  int local_180;
  int local_17c;
  int (*local_178) [32];
  long local_170;
  int (*local_168) [2] [32];
  Bmc_EsPar_t *local_160;
  int local_154;
  abctime local_150;
  ulong local_148;
  int (*local_140) [2] [32];
  int pLits [32];
  word pTruth [16];
  
  iMint = 1;
  local_150 = Abc_Clock();
  Abc_TtReadHex(pTruth,pPars->pTtStr);
  iVar12 = pPars->nVars;
  pwVar22 = (word *)(long)iVar12;
  if (10 < (long)pwVar22) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x35a,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  p = (Exa_Man_t_conflict *)calloc(1,0x20c0);
  p->pPars = pPars;
  p->nVars = iVar12;
  iVar1 = pPars->nNodes;
  p->nNodes = iVar1;
  iVar16 = iVar1 + iVar12;
  p->nObjs = iVar16;
  iVar20 = 1 << ((char)iVar12 - 6U & 0x1f);
  if (iVar12 < 7) {
    iVar20 = 1;
  }
  p->nWords = iVar20;
  p->pTruth = pTruth;
  local_160 = pPars;
  p_00 = Vec_WecStart(iVar16);
  p->vOutLits = p_00;
  if (0x20 < iVar16) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x22e,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  p->iVar = iVar1 * 3 + 1;
  local_168 = p->VarMarks;
  paaiVar14 = p->VarMarks + (long)pwVar22;
  while ((long)pwVar22 < (long)iVar16) {
    local_198 = local_168 + (long)pwVar22;
    local_1a8 = pwVar22;
    local_1a0 = paaiVar14;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      if ((local_160->fFewerVars == 0) || (lVar11 != 0)) {
LAB_004a2e21:
        lVar18 = (long)local_1a8 - lVar11;
        uVar23 = 0;
        if (local_160->fFewerVars != 0) {
          uVar23 = (ulong)(1 - (int)lVar11);
        }
        for (; (long)uVar23 < lVar18; uVar23 = uVar23 + 1) {
          iVar12 = p->iVar;
          iVar1 = Abc_Var2Lit(iVar12,0);
          Vec_WecPush(p_00,(int)uVar23,iVar1);
          p->iVar = iVar12 + 1;
          (*paaiVar14)[0][uVar23] = iVar12;
        }
      }
      else {
        iVar12 = p->nObjs;
        if (iVar12 + -1 != (int)local_1a8) goto LAB_004a2e21;
        iVar1 = p->iVar;
        iVar16 = Abc_Var2Lit(iVar1,0);
        Vec_WecPush(p_00,iVar12 + -2,iVar16);
        p->iVar = iVar1 + 1;
        *(int *)((long)(local_198 + -1) + 0xf8 + (long)iVar12 * 4) = iVar1;
      }
      paaiVar14 = (int (*) [2] [32])(*paaiVar14 + 1);
    }
    iVar16 = p->nObjs;
    paaiVar14 = local_1a0 + 1;
    pwVar22 = (word *)((long)local_1a8 + 1);
  }
  uVar21 = p->iVar;
  iVar20 = 0;
  printf("The number of parameter variables = %d.\n",(ulong)uVar21);
  pVVar6 = Vec_WrdStart((iVar16 + 1) * p->nWords);
  p->vInfo = pVVar6;
  iVar12 = p->nVars;
  iVar1 = 0;
  if (0 < iVar12) {
    iVar1 = iVar12;
  }
  for (; iVar1 != iVar20; iVar20 = iVar20 + 1) {
    pwVar22 = Exa_ManTruth(p,iVar20);
    Abc_TtIthVar(pwVar22,iVar20,iVar12);
  }
  p->vInfo = pVVar6;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,uVar21);
  local_148 = pTruth[0];
  if ((pTruth[0] & 1) != 0) {
    Abc_TtNot(pTruth,p->nWords);
  }
  local_154 = local_160->fOnlyAnd;
  lVar11 = (long)p->nVars;
  paaiVar14 = p->VarMarks + lVar11;
  local_178 = p->VarMarks[lVar11] + 1;
  while (paaiVar25 = local_168, uVar23 = (ulong)p->nObjs, lVar11 < (long)uVar23) {
    iVar12 = (int)lVar11 - p->nVars;
    local_190 = (ulong)(uint)(iVar12 * 3);
    iVar12 = iVar12 * 3 + 1;
    local_188 = 0;
    local_1a0 = paaiVar14;
    local_170 = lVar11;
    local_140 = paaiVar14;
    while( true ) {
      paaiVar14 = (int (*) [2] [32])0x0;
      for (lVar18 = 0; iVar1 = (int)paaiVar14, lVar18 < (int)uVar23; lVar18 = lVar18 + 1) {
        iVar16 = (*local_1a0)[0][lVar18];
        if (iVar16 != 0) {
          iVar16 = Abc_Var2Lit(iVar16,0);
          paaiVar14 = (int (*) [2] [32])(ulong)(iVar1 + 1);
          pLits[iVar1] = iVar16;
          uVar23 = (ulong)(uint)p->nObjs;
        }
      }
      if (iVar1 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x2dd,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
      }
      local_198 = paaiVar14;
      iVar16 = sat_solver_addclause(p->pSat,pLits,pLits + (long)paaiVar14);
      if (iVar16 == 0) goto LAB_004a32ac;
      lVar18 = 1;
      pwVar22 = (word *)0x0;
      while ((int (*) [2] [32])pwVar22 != local_198) {
        local_1a8 = (word *)((long)pwVar22 + 1);
        lVar19 = lVar18;
        while ((int)lVar19 < iVar1) {
          local_180 = Abc_LitNot(pLits[(long)pwVar22]);
          local_17c = Abc_LitNot(pLits[lVar19]);
          iVar16 = sat_solver_addclause(p->pSat,&local_180,(lit *)&local_178);
          lVar19 = lVar19 + 1;
          if (iVar16 == 0) goto LAB_004a32ac;
        }
        lVar18 = lVar18 + 1;
        pwVar22 = local_1a8;
      }
      if (local_188 == 1) break;
      uVar23 = (ulong)(uint)p->nObjs;
      paiVar24 = local_178;
      for (lVar18 = 0; lVar18 < (int)uVar23; lVar18 = lVar18 + 1) {
        if (paaiVar25[lVar11][0][lVar18] != 0) {
          for (lVar19 = 0; lVar19 + lVar18 < (long)(int)uVar23; lVar19 = lVar19 + 1) {
            if ((*paiVar24)[lVar19] != 0) {
              local_180 = Abc_Var2Lit(paaiVar25[lVar11][0][lVar18],1);
              local_17c = Abc_Var2Lit((*paiVar24)[lVar19],1);
              iVar1 = sat_solver_addclause(p->pSat,&local_180,(lit *)&local_178);
              if (iVar1 == 0) goto LAB_004a32ac;
              uVar23 = (ulong)(uint)p->nObjs;
            }
          }
        }
        paiVar24 = (int (*) [32])(*paiVar24 + 1);
      }
      local_188 = local_188 + 1;
      local_1a0 = (int (*) [2] [32])(*local_1a0 + 1);
    }
    iVar16 = (int)local_190 + 2;
    iVar20 = (int)local_190 + 3;
    iVar1 = 0;
    while (iVar1 != 3) {
      pLits[0] = Abc_Var2Lit(iVar12,(uint)(iVar1 == 1));
      pLits[1] = Abc_Var2Lit(iVar16,(uint)(iVar1 == 2));
      pLits[2] = Abc_Var2Lit(iVar20,(uint)(iVar1 != 0));
      iVar2 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
      iVar1 = iVar1 + 1;
      if (iVar2 == 0) goto LAB_004a32ac;
    }
    if (local_154 != 0) {
      pLits[0] = Abc_Var2Lit(iVar12,1);
      pLits[1] = Abc_Var2Lit(iVar16,1);
      pLits[2] = Abc_Var2Lit(iVar20,0);
      iVar12 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
      if (iVar12 == 0) goto LAB_004a32ac;
    }
    paaiVar14 = local_140 + 1;
    local_178 = local_178 + 2;
    lVar11 = local_170 + 1;
  }
  iVar12 = 0;
  while (iVar12 < p->nObjs + -1) {
    pVVar7 = Vec_WecEntry(p->vOutLits,iVar12);
    if ((long)pVVar7->nSize < 1) {
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x317,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
    }
    iVar1 = sat_solver_addclause(p->pSat,pVVar7->pArray,pVVar7->pArray + pVVar7->nSize);
    iVar12 = iVar12 + 1;
    if (iVar1 == 0) {
LAB_004a32ac:
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x35e,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
    }
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  iVar12 = 0;
  do {
    if (iMint == -1) {
LAB_004a386c:
      printf("Realization of given %d-input function using %d two-input gates:\n",
             (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
      uVar21 = p->nObjs;
      while (p->nVars < (int)uVar21) {
        uVar17 = uVar21 - 1;
        iVar12 = uVar17 - p->nVars;
        uVar3 = sat_solver_var_value(p->pSat,iVar12 * 3 + 1);
        uVar4 = sat_solver_var_value(p->pSat,iVar12 * 3 + 2);
        uVar5 = sat_solver_var_value(p->pSat,iVar12 * 3 + 3);
        if (((local_148 & 1) == 0) || (uVar21 != p->nObjs)) {
          pcVar15 = "%02d = 4\'b%d%d%d0(";
        }
        else {
          uVar5 = uVar5 ^ 1;
          uVar4 = uVar4 ^ 1;
          uVar3 = uVar3 ^ 1;
          pcVar15 = "%02d = 4\'b%d%d%d1(";
        }
        printf(pcVar15,(ulong)uVar17,(ulong)uVar5,(ulong)uVar4,(ulong)uVar3);
        for (iVar12 = 1; -1 < iVar12; iVar12 = iVar12 + -1) {
          uVar21 = Exa_ManFindFanin(p,uVar17,iVar12);
          if (((int)uVar21 < 0) || (p->nVars <= (int)uVar21)) {
            pcVar15 = " %02d";
          }
          else {
            uVar21 = uVar21 + 0x61;
            pcVar15 = " %c";
          }
          printf(pcVar15,(ulong)uVar21);
        }
        puts(" )");
        uVar21 = uVar17;
      }
LAB_004a3818:
      sat_solver_delete(p->pSat);
      Vec_WrdFree(p->vInfo);
      Vec_WecFree(p->vOutLits);
      free(p);
      aVar9 = Abc_Clock();
      Abc_PrintTime(0x79ba37,(char *)(aVar9 - local_150),time_00);
      return;
    }
    local_188 = CONCAT44(local_188._4_4_,iVar12);
    local_178 = (int (*) [32])Abc_Clock();
    uVar23 = p->pTruth[iMint >> 6];
    bVar10 = (byte)iMint;
    uVar21 = p->nVars;
    if (p->nVars < 1) {
      uVar21 = 0;
    }
    for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
      p->VarVals[uVar13] = (uint)(((uint)iMint >> ((uint)uVar13 & 0x1f) & 1) != 0);
    }
    sat_solver_setnvars(p->pSat,p->nNodes * 3 + p->iVar);
    local_1b0 = p->nVars * 3;
    paaiVar25 = (int (*) [2] [32])(ulong)((uint)(uVar23 >> (bVar10 & 0x3f)) & 1);
    for (paaiVar14 = (int (*) [2] [32])(long)p->nVars; uVar23 = (ulong)p->nObjs,
        (long)paaiVar14 < (long)uVar23; paaiVar14 = (int (*) [2] [32])((long)(*paaiVar14)[0] + 1)) {
      local_190 = (ulong)(uint)p->nVars;
      iVar12 = ((int)paaiVar14 - p->nVars) * 3 + p->iVar;
      local_1a0 = paaiVar25;
      local_198 = paaiVar14;
      for (pwVar22 = (word *)0x0; pwVar22 != (word *)0x2; pwVar22 = (word *)((long)pwVar22 + 1)) {
        iVar1 = (int)pwVar22;
        local_1a8 = pwVar22;
        for (lVar11 = 0; lVar11 < (int)uVar23; lVar11 = lVar11 + 1) {
          if (local_168[(long)paaiVar14][(long)pwVar22][lVar11] != 0) {
            paaiVar14 = local_168 + (long)paaiVar14;
            iVar16 = p->iVar;
            iVar20 = p->nVars;
            for (uVar21 = 0; uVar21 != 2; uVar21 = uVar21 + 1) {
              pLits[0] = Abc_Var2Lit((*paaiVar14)[(long)pwVar22][lVar11],1);
              pLits[1] = Abc_Var2Lit(iVar12 + iVar1,uVar21);
              if (lVar11 < p->nVars) {
                end = pLits + 2;
                if (uVar21 != p->VarVals[lVar11]) goto LAB_004a3464;
              }
              else {
                pLits[2] = Abc_Var2Lit(iVar16 + ((int)lVar11 - iVar20) * 3 + 2,uVar21 ^ 1);
                end = pLits + 3;
LAB_004a3464:
                iVar2 = sat_solver_addclause(p->pSat,pLits,end);
                if (iVar2 == 0) goto LAB_004a3811;
              }
            }
            uVar23 = (ulong)(uint)p->nObjs;
            paaiVar14 = local_198;
            pwVar22 = local_1a8;
          }
        }
      }
      local_1a8 = (word *)CONCAT44(local_1a8._4_4_,iVar12 + 1);
      local_170 = CONCAT44(local_170._4_4_,iVar12 + 2);
      local_190 = (ulong)(uint)(local_1b0 + (int)local_190 * -3);
      for (uVar21 = 0; uVar21 != 2; uVar21 = uVar21 + 1) {
        if ((p->nObjs + -1 != (int)paaiVar14) || (uVar21 != (uint)local_1a0)) {
          uVar23 = 0;
          while (uVar17 = (uint)uVar23, uVar17 != 4) {
            if ((uVar21 ^ 1) != 0 || uVar17 != 0) {
              pLits[0] = Abc_Var2Lit(iVar12,uVar17 & 1);
              pLits[1] = Abc_Var2Lit((int)local_1a8,(int)(uVar23 >> 1));
              uVar23 = 2;
              if (p->nObjs + -1 != (int)paaiVar14) {
                pLits[2] = Abc_Var2Lit((int)local_170,uVar21 ^ 1);
                uVar23 = 3;
              }
              uVar13 = uVar23;
              if (uVar17 != 0) {
                iVar1 = Abc_Var2Lit((int)local_190 + uVar17,uVar21);
                uVar13 = (ulong)((int)uVar23 + 1);
                pLits[uVar23] = iVar1;
              }
              iVar1 = sat_solver_addclause(p->pSat,pLits,pLits + uVar13);
              if (iVar1 == 0) goto LAB_004a3811;
            }
            uVar23 = (ulong)(uVar17 + 1);
          }
        }
      }
      local_1b0 = local_1b0 + 3;
      paaiVar25 = local_1a0;
    }
    p->iVar = p->iVar + p->nNodes * 3;
    iVar12 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (local_160->fVerbose != 0) {
      printf("Iter %3d : ",local_188 & 0xffffffff);
      Extra_PrintBinary(_stdout,(uint *)&iMint,p->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p->iVar);
      uVar21 = sat_solver_nclauses(p->pSat);
      printf("Cla =%6d  ",(ulong)uVar21);
      uVar21 = sat_solver_nconflicts(p->pSat);
      printf("Conf =%9d  ",(ulong)uVar21);
      aVar9 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar9 - (long)local_178),time);
    }
    if (iVar12 == -1) {
      puts("The problem has no solution.");
LAB_004a3811:
      if (iMint != -1) goto LAB_004a3818;
      goto LAB_004a386c;
    }
    iVar12 = p->nVars;
    iVar1 = iVar12 * 3;
    for (; iVar12 < p->nObjs; iVar12 = iVar12 + 1) {
      iVar16 = p->nVars;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        iVar20 = Exa_ManFindFanin(p,iVar12,(int)lVar11);
        pwVar22 = Exa_ManTruth(p,iVar20);
        pTruth[lVar11 + -0x10] = (word)pwVar22;
      }
      pwVar22 = Exa_ManTruth(p,iVar12);
      Abc_TtConst0(pwVar22,p->nWords);
      pwVar22 = (word *)CONCAT44(pLits[1],pLits[0]);
      local_1a8 = (word *)CONCAT44(pLits[3],pLits[2]);
      local_198 = (int (*) [2] [32])CONCAT44(local_198._4_4_,iVar1);
      for (uVar21 = 1; uVar21 != 4; uVar21 = uVar21 + 1) {
        iVar20 = sat_solver_var_value(p->pSat,uVar21 + iVar1 + iVar16 * -3);
        if (iVar20 != 0) {
          pwVar8 = Exa_ManTruth(p,p->nObjs);
          Abc_TtAndCompl(pwVar8,pwVar22,~uVar21 & 1,local_1a8,(uint)(uVar21 < 2),p->nWords);
          pwVar8 = Exa_ManTruth(p,iVar12);
          pIn1 = Exa_ManTruth(p,iVar12);
          pIn2 = Exa_ManTruth(p,p->nObjs);
          Abc_TtOr(pwVar8,pIn1,pIn2,p->nWords);
        }
      }
      iVar1 = (int)local_198 + 3;
    }
    pwVar22 = Exa_ManTruth(p,p->nObjs + -1);
    iVar12 = p->nVars;
    iVar1 = Abc_TtFindFirstDiffBit(pwVar22,p->pTruth,iVar12);
    if (1 << ((byte)iVar12 & 0x1f) <= iVar1) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x29a,"int Exa_ManEval(Exa_Man_t *)");
    }
    iVar12 = (int)local_188 + 1;
    iMint = iVar1;
  } while( true );
}

Assistant:

void Exa_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
        Exa_ManPrintSolution( p, fCompl );
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}